

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::GenerateFastInlineMathClz(Lowerer *this,Instr *instr)

{
  IRType IVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  IVar1 = instr->m_dst->m_type;
  if (IVar1 != TyInt32) {
    bVar3 = IRType_IsInt64(IVar1);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5281,"(instr->GetDst()->IsInt32() || instr->GetDst()->IsInt64())",
                         "instr->GetDst()->IsInt32() || instr->GetDst()->IsInt64()");
      if (!bVar3) goto LAB_005a7095;
      *puVar4 = 0;
    }
  }
  IVar1 = instr->m_src1->m_type;
  if (IVar1 != TyInt32) {
    bVar3 = IRType_IsInt64(IVar1);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5282,"(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsInt64())",
                         "instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsInt64()");
      if (!bVar3) {
LAB_005a7095:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  LowererMD::GenerateClz(&this->m_lowererMD,instr);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineMathClz(IR::Instr* instr)
{
    Assert(instr->GetDst()->IsInt32() || instr->GetDst()->IsInt64());
    Assert(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsInt64());
    m_lowererMD.GenerateClz(instr);
}